

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<kj::HttpHeaders::Header> * __thiscall
kj::ArrayBuilder<kj::HttpHeaders::Header>::operator=
          (ArrayBuilder<kj::HttpHeaders::Header> *this,ArrayBuilder<kj::HttpHeaders::Header> *other)

{
  RemoveConst<kj::HttpHeaders::Header> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (Header *)0x0;
  other->pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
  other->endPtr = (Header *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }